

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3rbu * rbuMisuseError(void)

{
  int iVar1;
  sqlite3rbu *__s;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    __s = (sqlite3rbu *)sqlite3Malloc(0x170);
  }
  else {
    __s = (sqlite3rbu *)0x0;
  }
  if (__s != (sqlite3rbu *)0x0) {
    memset(__s,0,0x170);
    __s->rc = 0x15;
  }
  return __s;
}

Assistant:

static sqlite3rbu *rbuMisuseError(void){
  sqlite3rbu *pRet;
  pRet = sqlite3_malloc64(sizeof(sqlite3rbu));
  if( pRet ){
    memset(pRet, 0, sizeof(sqlite3rbu));
    pRet->rc = SQLITE_MISUSE;
  }
  return pRet;
}